

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Annotation::Write(ON_OBSOLETE_V5_Annotation *this,ON_BinaryArchive *file)

{
  double dVar1;
  double dVar2;
  V5_eAnnotationType VVar3;
  bool bVar4;
  int iVar5;
  ON_2dPoint *pOVar6;
  ON_2dPoint *pOVar7;
  wchar_t *s;
  ON__INT32 local_104;
  ON__INT32 local_f4;
  bool local_ca;
  ON_wString local_68;
  ON_wString text_formula;
  bool bIsText;
  uint local_44;
  undefined1 local_40 [4];
  int bUserPositionedText;
  ON_2dPointArray points;
  bool bInChunk;
  bool rc;
  uint ui;
  ON_BinaryArchive *file_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  
  points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ = 0;
  iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
  points.super_ON_SimpleArray<ON_2dPoint>.m_count._2_1_ = 4 < iVar5;
  if ((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._2_1_) {
    points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
         ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,3);
    if (!(bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) {
      return false;
    }
  }
  else {
    points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
         ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  }
  if ((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ != false) {
    points.super_ON_SimpleArray<ON_2dPoint>.m_capacity = (int)this->m_type;
    points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
         ON_BinaryArchive::WriteInt(file,points.super_ON_SimpleArray<ON_2dPoint>.m_capacity);
    if ((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) {
      points.super_ON_SimpleArray<ON_2dPoint>.m_capacity = (int)this->m_textdisplaymode;
      points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
           ON_BinaryArchive::WriteInt(file,points.super_ON_SimpleArray<ON_2dPoint>.m_capacity);
      if (((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) &&
         (points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
               ON_BinaryArchive::WritePlane(file,&this->m_plane),
         (bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_)) {
        ON_2dPointArray::ON_2dPointArray((ON_2dPointArray *)local_40,&this->m_points);
        local_44 = this->m_userpositionedtext & 1;
        VVar3 = this->m_type;
        if ((byte)(VVar3 - dtDimLinear) < 2) {
          iVar5 = ON_SimpleArray<ON_2dPoint>::Count((ON_SimpleArray<ON_2dPoint> *)local_40);
          if (iVar5 == 4) {
            ON_SimpleArray<ON_2dPoint>::AppendNew((ON_SimpleArray<ON_2dPoint> *)local_40);
            pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]
                               ((ON_SimpleArray<ON_2dPoint> *)local_40,4);
            pOVar7 = ON_SimpleArray<ON_2dPoint>::operator[]
                               ((ON_SimpleArray<ON_2dPoint> *)local_40,0);
            dVar1 = pOVar7->x;
            pOVar7 = ON_SimpleArray<ON_2dPoint>::operator[]
                               ((ON_SimpleArray<ON_2dPoint> *)local_40,2);
            dVar2 = pOVar7->x;
            pOVar7 = ON_SimpleArray<ON_2dPoint>::operator[]
                               ((ON_SimpleArray<ON_2dPoint> *)local_40,1);
            ON_2dPoint::Set(pOVar6,(dVar1 + dVar2) * 0.5,pOVar7->y);
            local_44 = 0;
          }
        }
        else if (VVar3 != dtDimAngular) {
          if ((byte)(VVar3 - dtDimDiameter) < 2) {
            iVar5 = ON_SimpleArray<ON_2dPoint>::Count((ON_SimpleArray<ON_2dPoint> *)local_40);
            if (iVar5 == 4) {
              ON_SimpleArray<ON_2dPoint>::AppendNew((ON_SimpleArray<ON_2dPoint> *)local_40);
            }
            iVar5 = ON_SimpleArray<ON_2dPoint>::Count((ON_SimpleArray<ON_2dPoint> *)local_40);
            if (4 < iVar5) {
              pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]
                                 ((ON_SimpleArray<ON_2dPoint> *)local_40,2);
              pOVar7 = ON_SimpleArray<ON_2dPoint>::operator[]
                                 ((ON_SimpleArray<ON_2dPoint> *)local_40,4);
              pOVar7->x = pOVar6->x;
              pOVar7->y = pOVar6->y;
            }
            local_44 = 0;
          }
          else {
            local_44 = 0;
          }
        }
        points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
             ON_BinaryArchive::WriteArray(file,(ON_SimpleArray<ON_2dPoint> *)local_40);
        if ((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) {
          iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
          if (iVar5 < 5) {
            local_ca = WriteAnnotation2UserText_V4(file,&(this->m_usertext).super_ON_wString);
          }
          else {
            local_ca = WriteAnnotation2UserText_V5(file,&(this->m_usertext).super_ON_wString);
          }
          points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ = local_ca;
          if ((local_ca != false) &&
             (points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                   ON_BinaryArchive::WriteInt(file,local_44),
             (bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_)) {
            text_formula.m_s._7_1_ = IsText(this);
            points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                 ON_BinaryArchive::WriteInt(file,this->m_v5_3dm_archive_dimstyle_index);
            if ((((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) &&
                (((points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                        ON_BinaryArchive::WriteDouble(file,this->m_textheight),
                  (bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ &&
                  ((points.super_ON_SimpleArray<ON_2dPoint>.m_count._2_1_ & 1) != 0)) &&
                 (points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                       ON_BinaryArchive::WriteInt(file,this->m_justification),
                 (bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_)))) &&
               (points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                     ON_BinaryArchive::WriteBool(file,(bool)(this->m_annotative_scale & 1)),
               (bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_)) {
              s = TextFormula(this);
              ON_wString::ON_wString(&local_68,s);
              points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                   ON_BinaryArchive::WriteString(file,&local_68);
              if ((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) {
                if ((text_formula.m_s._7_1_ & 1) == 0) {
                  local_f4 = -1;
                }
                else {
                  local_f4 = this->m_v5_3dm_archive_dimstyle_index;
                }
                points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                     ON_BinaryArchive::WriteInt(file,local_f4);
                if ((bool)points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_) {
                  if ((text_formula.m_s._7_1_ & 1) == 0) {
                    local_104 = this->m_v5_3dm_archive_dimstyle_index;
                  }
                  else {
                    local_104 = -1;
                  }
                  points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
                       ON_BinaryArchive::WriteInt(file,local_104);
                }
              }
              ON_wString::~ON_wString(&local_68);
            }
          }
        }
        ON_2dPointArray::~ON_2dPointArray((ON_2dPointArray *)local_40);
      }
    }
  }
  if (((points.super_ON_SimpleArray<ON_2dPoint>.m_count._2_1_ & 1) != 0) &&
     (bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file), !bVar4)) {
    points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ = 0;
  }
  return (bool)(points.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ & 1);
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::Write( ON_BinaryArchive& file ) const
{
  //int i;
  unsigned int ui;
  bool rc = false;
  bool bInChunk = (file.Archive3dmVersion() >= 5 );
  if ( bInChunk )
  {
    // 18 October 2007 Dale Lear
    //   I modified this code so that V5 files can add
    //   information in ON_OBSOLETE_V5_Annotation chunks without
    //   breaking past and future file IO.
    //   The opennurbs version number before this change was
    //   20071017*.  I changed the version to 20071018* when
    //   I checked in this IO change.  The reason I can get
    //   away with this is that nobody except developers has
    //   a copy of V5 Rhino.
    // 28 Aug, 2010 - Lowell - changed minor version 0->1 to write
    //   annotative scale flag
    // 24 September 2010 Dale Lear 
    //   I incremented chunk version to 1.2 and wrote the TextFormula() string.
    rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,3);
    if (!rc)
      return false;
  }
  else
  {
    // For archives with opennurbs version < 200710180
    // The code before version 200710180 does not properly
    // handle new additions to the ON_OBSOLETE_V5_Annotation chunk.  
    rc = file.Write3dmChunkVersion( 1, 0 );
  }

  while(rc)
  {
    ui = static_cast<unsigned char>(m_type);
    rc = file.WriteInt(ui);
    if ( !rc) break;

    ui = (unsigned int)m_textdisplaymode;    
    rc = file.WriteInt(ui);
    if ( !rc) break;

    // June 17, 2010 - Lowell - Added adjustment to position text
    // a little better in pre-v5 files.
    // There's no adjustment for right/left justify because we don't
    // know the width of the text here
    // This doesn't change the size or position of any fields being
    // written, but just adjusts the plane to tune up the alignment

    // 16 Nov, 2011 - Lowell - Change text to bottom left justified for pre-v5 files rr94270
    // This stuff is moved to CRhinoDoc::Write3DMHelper() so it will help with other file
    // formats too
    //ON_Plane plane = m_plane;
    //if(file.Archive3dmVersion() <= 4 && m_type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock)
    //{
    //  double height = m_textheight;
    //  int lines = CountTextLines(m_usertext);
    //  double linefeed = ON_Font::m_default_linefeed_ratio;

    //  if(m_justification & tjBottom)
    //  {
    //    if(lines > 1)
    //    {
    //      ON_3dPoint p = plane.PointAt(0.0, -height * (lines-1) * linefeed);
    //      plane.SetOrigin(p);
    //    }
    //  }
    //  else if(m_justification & tjMiddle)
    //  {
    //    double h = height * (lines-1) * linefeed + height;
    //    ON_3dPoint p = plane.PointAt(0.0, h * 0.5);
    //    plane.SetOrigin(p);
    //  }
    //  else if(m_justification & tjTop)
    //  {
    //    ON_3dPoint p = plane.PointAt(0.0, -height);
    //    plane.SetOrigin(p);
    //  }
    //}
  
    rc = file.WritePlane(m_plane);
    if ( !rc) break;

    ON_2dPointArray points = m_points;
    int bUserPositionedText = m_userpositionedtext?1:0;
    switch( m_type )
    {
    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
      if ( 4 == points.Count() )
      {
        // so old versions will read enough points.
        points.AppendNew();
        points[4].Set(0.5*(points[0].x + points[2].x),points[1].y);
        bUserPositionedText = false;
      }
      break;

    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
      //user positioned text is supported.
      break;

    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
      // 9 August 2005 Dale Lear - radial dimensions do
      // not support user positioned text.  The never have
      // in Rhino, but the old files had 5 points in them.
      if ( 4 == points.Count() )
      {
        // so old versions will read enough points.
        points.AppendNew();
      }
      if ( points.Count() >= 5 )
      {
        points[4] = points[2];
      }
      bUserPositionedText = false;
      break;

    default:
      bUserPositionedText = false;
      break;
    }
    
    rc = file.WriteArray( points);
    if ( !rc) break;
    
    // June 17, 2010 - Lowell - Added support for writing word-wrapped text
    // to pre-v5 files with hard returns in place of wrapping markers
    rc = ( file.Archive3dmVersion() <= 4 )
       ? WriteAnnotation2UserText_V4(file,m_usertext)
       : WriteAnnotation2UserText_V5(file,m_usertext);
    if ( !rc) break;
    // 7-9-03 lw removed extra text string getting written
    
    rc = file.WriteInt( bUserPositionedText );
    if ( !rc) break;
    

    const bool bIsText = IsText();
    //rc = file.Write3dmReferencedComponentIndex(
    //  bIsText ? ON_ModelComponent::Type::TextStyle : ON_ModelComponent::Type::DimStyle, m_dimstyle_index );
    rc = file.WriteInt(m_v5_3dm_archive_dimstyle_index);
    if ( !rc) break;

    rc = file.WriteDouble( m_textheight);
    if ( !rc) break;

    if ( !bInChunk )
      break;

    // NOTE WELL - NEVER change the code in this function
    //             above this comment.  If you do, you will
    //             break reading and writing V4 files.
    //             Ask Dale Lear if you have any questions.

    // 18 October 2007 - Dale Lear added m_justification IO
    rc = file.WriteInt(m_justification);
    if ( !rc) 
      break;

    // 28 Aug 2010 - Lowell - Added flag for whether text gets scaled in modelspace
    rc = file.WriteBool(m_annotative_scale);
    if(!rc)
      break;

    // 24 September 2010 Dale Lear 
    //   I incremented chunk version to 1.2
    ON_wString text_formula = TextFormula();
    rc = file.WriteString(text_formula);
    if(!rc)
      break;

    // To write more ON_OBSOLETE_V5_Annotation fields, increment the minor version
    // number and write the new information here.

    // September 2015 Dale Lear
    //   I incremented chunk version to 1.3
    //   and separated text style and dim style
    //rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::TextStyle, bIsText ? m_dimstyle_index : -1 );
    //if ( !rc) break;
    //rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::DimStyle, bIsText ? -1 : m_dimstyle_index );
    //if ( !rc) break;
    rc = file.WriteInt( bIsText ? m_v5_3dm_archive_dimstyle_index : -1 );
    if ( !rc) break;
    rc = file.WriteInt( bIsText ? -1 : m_v5_3dm_archive_dimstyle_index );
    if ( !rc) break;

    // Finished writing ON_OBSOLETE_V5_Annotation information
    break;
  }

  if ( bInChunk )
  {
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  return rc;
}